

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          first,__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                last)

{
  Detail *pDVar1;
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  string local_50;
  
  ReusableStringStream::ReusableStringStream(&RStack_68);
  std::__ostream_insert<char,std::char_traits<char>>(RStack_68.m_oss,"{ ",2);
  if (this != (Detail *)first._M_current) {
    rangeToString<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              (&local_50,*(Detail **)this,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               *(int **)(this + 8),
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               last._M_current);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_68.m_oss,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pDVar1 = this + 0x18;
    if (pDVar1 != (Detail *)first._M_current) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(RStack_68.m_oss,", ",2);
        rangeToString<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  (&local_50,*(Detail **)pDVar1,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   *(int **)(pDVar1 + 8),
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   last._M_current);
        std::__ostream_insert<char,std::char_traits<char>>
                  (RStack_68.m_oss,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pDVar1 = pDVar1 + 0x18;
      } while (pDVar1 != (Detail *)first._M_current);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(RStack_68.m_oss," }",2);
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&RStack_68);
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }